

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktComputeBasicComputeShaderTests.cpp
# Opt level: O1

TestStatus *
vkt::compute::anon_unknown_0::EmptyShaderTest::createTest
          (TestStatus *__return_storage_ptr__,Context *context)

{
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
  *this;
  deUint32 queueFamilyIndex;
  DeviceInterface *deviceInterface;
  VkDevice device;
  const_iterator cVar1;
  Unique<vk::Handle<(vk::HandleType)18>_> pipeline;
  Unique<vk::VkCommandBuffer_s_*> cmdBuffer;
  Unique<vk::Handle<(vk::HandleType)16>_> pipelineLayout;
  Unique<vk::Handle<(vk::HandleType)24>_> cmdPool;
  undefined1 local_108 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_f8;
  Move<vk::Handle<(vk::HandleType)24>_> local_e8;
  undefined1 local_c8 [16];
  VkDevice local_b8;
  VkCommandPool VStack_b0;
  Move<vk::Handle<(vk::HandleType)14>_> local_a8;
  Move<vk::Handle<(vk::HandleType)18>_> local_88;
  VkQueue local_60;
  VkShaderModule local_58;
  Deleter<vk::Handle<(vk::HandleType)14>_> DStack_50;
  
  deviceInterface = Context::getDeviceInterface(context);
  device = Context::getDevice(context);
  local_60 = Context::getUniversalQueue(context);
  queueFamilyIndex = Context::getUniversalQueueFamilyIndex(context);
  this = (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
          *)context->m_progCollection;
  local_108._0_8_ = &local_f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_108,"comp","");
  cVar1 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
          ::find(this,(key_type *)local_108);
  ::vk::createShaderModule
            (&local_a8,deviceInterface,device,*(ProgramBinary **)(cVar1._M_node + 2),0);
  DStack_50.m_device =
       local_a8.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.m_device;
  DStack_50.m_allocator =
       local_a8.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.m_allocator;
  local_58.m_internal =
       local_a8.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.object.m_internal;
  DStack_50.m_deviceIface =
       local_a8.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.m_deviceIface;
  local_a8.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.object.m_internal = 0;
  local_a8.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)0x0;
  local_a8.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.m_device = (VkDevice)0x0;
  local_a8.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_108._0_8_ != &local_f8) {
    operator_delete((void *)local_108._0_8_,local_f8._M_allocated_capacity + 1);
  }
  makePipelineLayout((Move<vk::Handle<(vk::HandleType)16>_> *)local_108,deviceInterface,device);
  local_a8.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.m_device =
       (VkDevice)local_f8._M_allocated_capacity;
  local_a8.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)local_f8._8_8_;
  local_a8.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.object.m_internal = local_108._0_8_
  ;
  local_a8.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)local_108._8_8_;
  makeComputePipeline(&local_88,deviceInterface,device,(VkPipelineLayout)local_108._0_8_,local_58);
  local_f8._M_allocated_capacity =
       (size_type)local_88.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_device;
  local_f8._8_8_ =
       local_88.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_allocator;
  local_108._0_8_ = local_88.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.object.m_internal
  ;
  local_108._8_8_ =
       local_88.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_deviceIface;
  makeCommandPool(&local_e8,deviceInterface,device,queueFamilyIndex);
  local_88.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_device =
       local_e8.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_device;
  local_88.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_allocator =
       local_e8.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_allocator;
  local_88.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.object.m_internal =
       local_e8.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.m_internal;
  local_88.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_deviceIface =
       local_e8.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_deviceIface;
  ::vk::allocateCommandBuffer
            ((Move<vk::VkCommandBuffer_s_*> *)local_c8,deviceInterface,device,
             (VkCommandPool)
             local_e8.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.m_internal,
             VK_COMMAND_BUFFER_LEVEL_PRIMARY);
  local_e8.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_device = local_b8;
  local_e8.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)VStack_b0.m_internal;
  local_e8.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.m_internal = local_c8._0_8_;
  local_e8.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)local_c8._8_8_;
  beginCommandBuffer(deviceInterface,(VkCommandBuffer)local_c8._0_8_);
  (*deviceInterface->_vptr_DeviceInterface[0x4c])
            (deviceInterface,
             local_e8.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.m_internal,1,
             local_108._0_8_);
  (*deviceInterface->_vptr_DeviceInterface[0x5d])
            (deviceInterface,
             local_e8.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.m_internal,1,1,1)
  ;
  endCommandBuffer(deviceInterface,
                   (VkCommandBuffer)
                   local_e8.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.m_internal)
  ;
  submitCommandsAndWait
            (deviceInterface,device,local_60,
             (VkCommandBuffer)
             local_e8.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.m_internal);
  local_c8._0_8_ = (VkCommandBuffer)&local_b8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_c8,"Compute succeeded","");
  __return_storage_ptr__->m_code = QP_TEST_RESULT_PASS;
  (__return_storage_ptr__->m_description)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->m_description).field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&__return_storage_ptr__->m_description,local_c8._0_8_,
             (VkCommandBuffer)(local_c8._0_8_ + (long)(_func_int ***)local_c8._8_8_));
  if ((VkCommandBuffer)local_c8._0_8_ != (VkCommandBuffer)&local_b8) {
    operator_delete((void *)local_c8._0_8_,(ulong)(local_b8 + 1));
  }
  if ((VkCommandBuffer)
      local_e8.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.m_internal !=
      (VkCommandBuffer)0x0) {
    local_c8._0_8_ =
         local_e8.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.m_internal;
    (*(local_e8.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_deviceIface)->
      _vptr_DeviceInterface[0x48])
              (local_e8.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_deviceIface,
               local_e8.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_device,
               local_e8.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_allocator,1)
    ;
  }
  if (local_88.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.object.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)24>_>::operator()
              ((Deleter<vk::Handle<(vk::HandleType)24>_> *)
               &local_88.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter,
               (VkCommandPool)
               local_88.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.object.m_internal);
  }
  if ((pointer)local_108._0_8_ != (pointer)0x0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)18>_>::operator()
              ((Deleter<vk::Handle<(vk::HandleType)18>_> *)(local_108 + 8),
               (VkPipeline)local_108._0_8_);
  }
  if (local_a8.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.object.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)16>_>::operator()
              ((Deleter<vk::Handle<(vk::HandleType)16>_> *)
               &local_a8.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter,
               (VkPipelineLayout)
               local_a8.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.object.m_internal);
  }
  if (local_58.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)14>_>::operator()(&DStack_50,local_58);
  }
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus createTest (Context& context)
{
	const DeviceInterface&	vk					= context.getDeviceInterface();
	const VkDevice			device				= context.getDevice();
	const VkQueue			queue				= context.getUniversalQueue();
	const deUint32			queueFamilyIndex	= context.getUniversalQueueFamilyIndex();

	const Unique<VkShaderModule> shaderModule(createShaderModule(vk, device, context.getBinaryCollection().get("comp"), 0u));

	const Unique<VkPipelineLayout> pipelineLayout(makePipelineLayout(vk, device));
	const Unique<VkPipeline> pipeline(makeComputePipeline(vk, device, *pipelineLayout, *shaderModule));

	const Unique<VkCommandPool> cmdPool(makeCommandPool(vk, device, queueFamilyIndex));
	const Unique<VkCommandBuffer> cmdBuffer(allocateCommandBuffer(vk, device, *cmdPool, VK_COMMAND_BUFFER_LEVEL_PRIMARY));

	// Start recording commands

	beginCommandBuffer(vk, *cmdBuffer);

	vk.cmdBindPipeline(*cmdBuffer, VK_PIPELINE_BIND_POINT_COMPUTE, *pipeline);

	const tcu::IVec3 workGroups(1, 1, 1);
	vk.cmdDispatch(*cmdBuffer, workGroups.x(), workGroups.y(), workGroups.z());

	endCommandBuffer(vk, *cmdBuffer);

	submitCommandsAndWait(vk, device, queue, *cmdBuffer);

	return tcu::TestStatus::pass("Compute succeeded");
}